

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btHashInt>::resize
          (btAlignedObjectArray<btHashInt> *this,int newsize,btHashInt *fillData)

{
  int iVar1;
  btHashInt *pbVar2;
  long lVar3;
  
  iVar1 = this->m_size;
  lVar3 = (long)iVar1;
  if (iVar1 <= newsize) {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    pbVar2 = this->m_data;
    for (; lVar3 < newsize; lVar3 = lVar3 + 1) {
      pbVar2[lVar3].m_uid = fillData->m_uid;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}